

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_CustomMeleeAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  VMValue *pVVar2;
  AActor *pAVar3;
  AActor *target;
  bool bVar4;
  int local_ac;
  bool local_7f;
  FSoundID local_7c;
  TAngle<double> local_78;
  FName local_70;
  int local_6c;
  FSoundID local_68;
  int newdam;
  FName local_60;
  bool bleed;
  FName damagetype;
  FSoundID local_54;
  FSoundID local_50;
  FSoundID misssound;
  FSoundID local_48;
  int local_44;
  FSoundID meleesound;
  int damage;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6a9,
                  "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    _meleesound = (AActor *)(param->field_0).field_1.a;
    local_7f = true;
    if (_meleesound != (AActor *)0x0) {
      local_7f = DObject::IsKindOf((DObject *)_meleesound,AActor::RegistrationInfo.MyClass);
    }
    if (local_7f != false) {
      if (numparam < 2) {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6aa,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        local_44 = (pVVar2->field_0).i;
      }
      else {
        if (param[1].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6aa,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        local_44 = param[1].field_0.i;
      }
      FSoundID::FSoundID(&local_48);
      if (numparam < 3) {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6ab,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        FSoundID::FSoundID(&local_50,(pVVar2->field_0).i);
        FSoundID::operator=(&local_48,&local_50);
      }
      else {
        if (param[2].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6ab,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        FSoundID::FSoundID(&misssound,param[2].field_0.i);
        FSoundID::operator=(&local_48,&misssound);
      }
      FSoundID::FSoundID(&local_54);
      if (numparam < 4) {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6ac,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        FSoundID::FSoundID((FSoundID *)&stack0xffffffffffffffa4,(pVVar2->field_0).i);
        FSoundID::operator=(&local_54,(FSoundID *)&stack0xffffffffffffffa4);
      }
      else {
        if (param[3].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6ac,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        FSoundID::FSoundID((FSoundID *)&damagetype,param[3].field_0.i);
        FSoundID::operator=(&local_54,(FSoundID *)&damagetype);
      }
      FName::FName(&local_60);
      if (numparam < 5) {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6ad,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        FName::operator=(&local_60,(pVVar2->field_0).i);
      }
      else {
        if (param[4].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6ad,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        FName::operator=(&local_60,param[4].field_0.i);
      }
      if (numparam < 6) {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6ae,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        iVar1 = (pVVar2->field_0).i;
      }
      else {
        if (param[5].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6ae,
                        "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar1 = param[5].field_0.i;
      }
      newdam._3_1_ = iVar1 != 0;
      bVar4 = FName::operator==(&local_60,NAME_None);
      if (bVar4) {
        FName::operator=(&local_60,NAME_Melee);
      }
      pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_meleesound->target);
      if (pAVar3 != (AActor *)0x0) {
        A_FaceTarget(_meleesound);
        bVar4 = AActor::CheckMeleeRange(_meleesound);
        if (bVar4) {
          iVar1 = FSoundID::operator_cast_to_int(&local_48);
          pAVar3 = _meleesound;
          if (iVar1 != 0) {
            FSoundID::FSoundID(&local_68,&local_48);
            S_Sound(pAVar3,1,&local_68,1.0,1.0);
          }
          target = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_meleesound->target);
          pAVar3 = _meleesound;
          iVar1 = local_44;
          FName::FName(&local_70,&local_60);
          TAngle<double>::TAngle(&local_78,0.0);
          local_6c = P_DamageMobj(target,pAVar3,pAVar3,iVar1,&local_70,0,&local_78);
          if ((newdam._3_1_ & 1) != 0) {
            local_ac = local_6c;
            if (local_6c < 1) {
              local_ac = local_44;
            }
            pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_meleesound->target);
            P_TraceBleed(local_ac,pAVar3,_meleesound);
          }
        }
        else {
          iVar1 = FSoundID::operator_cast_to_int(&local_54);
          pAVar3 = _meleesound;
          if (iVar1 != 0) {
            FSoundID::FSoundID(&local_7c,&local_54);
            S_Sound(pAVar3,1,&local_7c,1.0,1.0);
          }
        }
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6a9,
                  "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x6a9,
                "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomMeleeAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(damage);
	PARAM_SOUND_DEF	(meleesound);
	PARAM_SOUND_DEF	(misssound);
	PARAM_NAME_DEF	(damagetype);
	PARAM_BOOL_DEF	(bleed);

	if (damagetype == NAME_None)
		damagetype = NAME_Melee;	// Melee is the default type

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		if (meleesound)
			S_Sound (self, CHAN_WEAPON, meleesound, 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, damagetype);
		if (bleed)
			P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
	}
	else
	{
		if (misssound)
			S_Sound (self, CHAN_WEAPON, misssound, 1, ATTN_NORM);
	}
	return 0;
}